

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

Triple * __thiscall llvm::Triple::get64BitArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  pointer pcVar1;
  ObjectFormatType OVar2;
  SubArchType SVar3;
  VendorType VVar4;
  OSType OVar5;
  size_t sVar6;
  char *pcVar7;
  StringRef Str;
  
  (__return_storage_ptr__->Data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Data).field_2
  ;
  pcVar1 = (this->Data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Data)._M_string_length);
  OVar2 = this->ObjectFormat;
  __return_storage_ptr__->Environment = this->Environment;
  __return_storage_ptr__->ObjectFormat = OVar2;
  SVar3 = this->SubArch;
  VVar4 = this->Vendor;
  OVar5 = this->OS;
  __return_storage_ptr__->Arch = this->Arch;
  __return_storage_ptr__->SubArch = SVar3;
  __return_storage_ptr__->Vendor = VVar4;
  __return_storage_ptr__->OS = OVar5;
  switch(this->Arch) {
  case UnknownArch:
  case arc:
  case avr:
  case hexagon:
  case msp430:
  case nios2:
  case r600:
  case sparcel:
  case tce:
  case tcele:
  case xcore:
  case kalimba:
  case shave:
  case lanai:
    pcVar7 = "unknown";
    break;
  case arm:
  case thumb:
    pcVar7 = "aarch64";
    break;
  case armeb:
  case thumbeb:
    pcVar7 = "aarch64_be";
    sVar6 = 10;
    goto LAB_001905c9;
  default:
    goto switchD_001905bb_caseD_3;
  case mips:
    pcVar7 = "mips64";
    goto LAB_00190671;
  case mipsel:
    pcVar7 = "mips64el";
    sVar6 = 8;
    goto LAB_001905c9;
  case ppc:
    pcVar7 = "powerpc64";
    sVar6 = 9;
    goto LAB_001905c9;
  case riscv32:
    pcVar7 = "riscv64";
    break;
  case sparc:
    pcVar7 = "sparcv9";
    break;
  case x86:
    pcVar7 = "x86_64";
    goto LAB_00190671;
  case nvptx:
    pcVar7 = "nvptx64";
    break;
  case le32:
    pcVar7 = "le64";
    sVar6 = 4;
    goto LAB_001905c9;
  case amdil:
    pcVar7 = "amdil64";
    break;
  case hsail:
    pcVar7 = "hsail64";
    break;
  case spir:
    pcVar7 = "spir64";
    goto LAB_00190671;
  case wasm32:
    pcVar7 = "wasm64";
LAB_00190671:
    sVar6 = 6;
    goto LAB_001905c9;
  case renderscript32:
    pcVar7 = "renderscript64";
    sVar6 = 0xe;
    goto LAB_001905c9;
  }
  sVar6 = 7;
LAB_001905c9:
  Str.Length = sVar6;
  Str.Data = pcVar7;
  setArchName(__return_storage_ptr__,Str);
switchD_001905bb_caseD_3:
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::get64BitArchVariant() const {
  Triple T(*this);
  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::arc:
  case Triple::avr:
  case Triple::hexagon:
  case Triple::kalimba:
  case Triple::lanai:
  case Triple::msp430:
  case Triple::nios2:
  case Triple::r600:
  case Triple::tce:
  case Triple::tcele:
  case Triple::xcore:
  case Triple::sparcel:
  case Triple::shave:
    T.setArch(UnknownArch);
    break;

  case Triple::aarch64:
  case Triple::aarch64_be:
  case Triple::bpfel:
  case Triple::bpfeb:
  case Triple::le64:
  case Triple::amdil64:
  case Triple::amdgcn:
  case Triple::hsail64:
  case Triple::spir64:
  case Triple::mips64:
  case Triple::mips64el:
  case Triple::nvptx64:
  case Triple::ppc64:
  case Triple::ppc64le:
  case Triple::riscv64:
  case Triple::sparcv9:
  case Triple::systemz:
  case Triple::x86_64:
  case Triple::wasm64:
  case Triple::renderscript64:
    // Already 64-bit.
    break;

  case Triple::arm:             T.setArch(Triple::aarch64);    break;
  case Triple::armeb:           T.setArch(Triple::aarch64_be); break;
  case Triple::le32:            T.setArch(Triple::le64);       break;
  case Triple::mips:            T.setArch(Triple::mips64);     break;
  case Triple::mipsel:          T.setArch(Triple::mips64el);   break;
  case Triple::nvptx:           T.setArch(Triple::nvptx64);    break;
  case Triple::ppc:             T.setArch(Triple::ppc64);      break;
  case Triple::sparc:           T.setArch(Triple::sparcv9);    break;
  case Triple::riscv32:         T.setArch(Triple::riscv64);    break;
  case Triple::x86:             T.setArch(Triple::x86_64);     break;
  case Triple::amdil:           T.setArch(Triple::amdil64);    break;
  case Triple::hsail:           T.setArch(Triple::hsail64);    break;
  case Triple::spir:            T.setArch(Triple::spir64);     break;
  case Triple::thumb:           T.setArch(Triple::aarch64);    break;
  case Triple::thumbeb:         T.setArch(Triple::aarch64_be); break;
  case Triple::wasm32:          T.setArch(Triple::wasm64);     break;
  case Triple::renderscript32:  T.setArch(Triple::renderscript64);     break;
  }
  return T;
}